

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_avx2_256_32.c
# Opt level: O3

parasail_result_t *
parasail_nw_table_scan_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  void *pvVar1;
  parasail_matrix_t *ppVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  int iVar7;
  int iVar8;
  parasail_result_t *ppVar9;
  __m256i *ptr;
  int32_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  __m256i *palVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  __m256i *palVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  ulong size;
  undefined8 uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  __m256i alVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  long local_a0;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_table_scan_profile_avx2_256_32_cold_8();
  }
  else {
    pvVar1 = (profile->profile32).score;
    if (pvVar1 == (void *)0x0) {
      parasail_nw_table_scan_profile_avx2_256_32_cold_7();
    }
    else {
      ppVar2 = profile->matrix;
      if (ppVar2 == (parasail_matrix_t *)0x0) {
        parasail_nw_table_scan_profile_avx2_256_32_cold_6();
      }
      else {
        uVar11 = profile->s1Len;
        if ((int)uVar11 < 1) {
          parasail_nw_table_scan_profile_avx2_256_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_table_scan_profile_avx2_256_32_cold_4();
        }
        else {
          uVar20 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_table_scan_profile_avx2_256_32_cold_3();
          }
          else if (open < 0) {
            parasail_nw_table_scan_profile_avx2_256_32_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_table_scan_profile_avx2_256_32_cold_1();
          }
          else {
            uVar16 = uVar11 - 1;
            size = (ulong)uVar11 + 7 >> 3;
            iVar7 = (int)(uVar16 / size);
            iVar17 = -open;
            iVar8 = ppVar2->min;
            uVar18 = 0x80000000 - iVar8;
            if (iVar8 != iVar17 && SBORROW4(iVar8,iVar17) == iVar8 + open < 0) {
              uVar18 = open | 0x80000000;
            }
            iVar8 = 0x7ffffffe - ppVar2->max;
            ppVar9 = parasail_result_new_table1((uint)((ulong)uVar11 + 7) & 0x7ffffff8,s2Len);
            if (ppVar9 != (parasail_result_t *)0x0) {
              ppVar9->flag = ppVar9->flag | 0x8420401;
              ptr = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign_int32_t(0x20,(ulong)(s2Len + 1));
              ptr_01 = parasail_memalign___m256i(0x20,size);
              ptr_02 = parasail_memalign___m256i(0x20,size);
              ptr_03 = parasail_memalign___m256i(0x20,size);
              if (ptr_03 != (__m256i *)0x0 &&
                  ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                  (ptr_00 != (int32_t *)0x0 && ptr != (__m256i *)0x0))) {
                iVar10 = s2Len + -1;
                auVar26._4_4_ = open;
                auVar26._0_4_ = open;
                auVar26._8_4_ = open;
                auVar26._12_4_ = open;
                auVar26._16_4_ = open;
                auVar26._20_4_ = open;
                auVar26._24_4_ = open;
                auVar26._28_4_ = open;
                auVar28._4_4_ = gap;
                auVar28._0_4_ = gap;
                auVar28._8_4_ = gap;
                auVar28._12_4_ = gap;
                auVar28._16_4_ = gap;
                auVar28._20_4_ = gap;
                auVar28._24_4_ = gap;
                auVar28._28_4_ = gap;
                iVar21 = uVar18 + 1;
                auVar24._4_4_ = iVar21;
                auVar24._0_4_ = iVar21;
                auVar24._8_4_ = iVar21;
                auVar24._12_4_ = iVar21;
                auVar24._16_4_ = iVar21;
                auVar24._20_4_ = iVar21;
                auVar24._24_4_ = iVar21;
                auVar24._28_4_ = iVar21;
                auVar25._4_4_ = iVar8;
                auVar25._0_4_ = iVar8;
                auVar25._8_4_ = iVar8;
                auVar25._12_4_ = iVar8;
                auVar25._16_4_ = iVar8;
                auVar25._20_4_ = iVar8;
                auVar25._24_4_ = iVar8;
                auVar25._28_4_ = iVar8;
                iVar8 = -(gap * (int)size);
                auVar30._4_4_ = iVar8;
                auVar30._0_4_ = iVar8;
                auVar30._8_4_ = iVar8;
                auVar30._12_4_ = iVar8;
                auVar30._16_4_ = iVar8;
                auVar30._20_4_ = iVar8;
                auVar30._24_4_ = iVar8;
                auVar30._28_4_ = iVar8;
                auVar30 = vpblendd_avx2(auVar30,SUB6432(ZEXT1664((undefined1  [16])0x0),0),1);
                auVar29 = ZEXT1232(CONCAT84(SUB128(ZEXT812(0),4),iVar21));
                auVar30 = vpaddd_avx2(auVar29,auVar30);
                auVar35._4_4_ = 0;
                auVar35._0_4_ = open;
                auVar31._4_4_ = iVar17;
                auVar31._0_4_ = iVar17;
                auVar31._8_4_ = iVar17;
                auVar31._12_4_ = iVar17;
                auVar31._16_4_ = iVar17;
                auVar31._20_4_ = iVar17;
                auVar31._24_4_ = iVar17;
                auVar31._28_4_ = iVar17;
                auVar34._8_8_ = size;
                auVar34._0_8_ = size;
                auVar34._16_8_ = size;
                auVar34._24_8_ = size;
                auVar5 = vpmuldq_avx2(auVar34,_DAT_00908c60);
                auVar6 = vpmuldq_avx2(auVar34,_DAT_00908b60);
                auVar35._8_4_ = open;
                auVar35._12_4_ = 0;
                auVar35._16_4_ = open;
                auVar35._20_4_ = 0;
                auVar35._24_4_ = open;
                auVar35._28_4_ = 0;
                uVar12 = 0;
                auVar34 = vpmovsxbd_avx2(ZEXT816(0x706060406040200));
                auVar37._8_8_ = 0xffffffff80000000;
                auVar37._0_8_ = 0xffffffff80000000;
                auVar37._16_8_ = 0xffffffff80000000;
                auVar37._24_8_ = 0xffffffff80000000;
                palVar14 = ptr_02;
                palVar19 = ptr;
                do {
                  auVar42._8_8_ = uVar12;
                  auVar42._0_8_ = uVar12;
                  auVar42._16_8_ = uVar12;
                  auVar42._24_8_ = uVar12;
                  auVar36 = vpaddq_avx2(auVar42,auVar5);
                  auVar42 = vpaddq_avx2(auVar6,auVar42);
                  auVar42 = vpermd_avx2(auVar34,auVar42);
                  auVar36 = vpermd_avx2(auVar34,auVar36);
                  auVar39._0_16_ = ZEXT116(0) * auVar36._0_16_ + ZEXT116(1) * auVar42._0_16_;
                  auVar39._16_16_ = ZEXT116(0) * auVar42._16_16_ + ZEXT116(1) * auVar36._0_16_;
                  auVar36 = vpmulld_avx2(auVar28,auVar39);
                  alVar27 = (__m256i)vpsubd_avx2(auVar31,auVar36);
                  auVar36 = vpmovsxdq_avx2(alVar27._16_16_);
                  auVar42 = vpmovsxdq_avx2(alVar27._0_16_);
                  auVar39 = vpsubq_avx2(auVar36,auVar35);
                  auVar36 = vpcmpgtq_avx2(auVar39,auVar37);
                  auVar36 = vblendvpd_avx(auVar37,auVar39,auVar36);
                  auVar39 = vpsubq_avx2(auVar42,auVar35);
                  auVar42 = vpcmpgtq_avx2(auVar39,auVar37);
                  auVar42 = vblendvpd_avx(auVar37,auVar39,auVar42);
                  auVar42 = vpermd_avx2(auVar34,auVar42);
                  auVar36 = vpermd_avx2(auVar34,auVar36);
                  *palVar14 = alVar27;
                  *(undefined1 (*) [16])(*palVar19 + 2) = auVar36._0_16_;
                  *(undefined1 (*) [16])*palVar19 = auVar42._0_16_;
                  uVar12 = uVar12 + 1;
                  palVar19 = palVar19 + 1;
                  palVar14 = palVar14 + 1;
                } while (size != uVar12);
                *ptr_00 = 0;
                lVar13 = uVar20 - 1;
                auVar38._8_8_ = lVar13;
                auVar38._0_8_ = lVar13;
                auVar38._16_8_ = lVar13;
                auVar38._24_8_ = lVar13;
                auVar34 = vpmovsxbd_avx2(ZEXT816(0x807060504030201));
                uVar12 = 0;
                auVar6 = vpmovsxbq_avx2(ZEXT416(0x3020100));
                auVar35 = vpmovsxbq_avx2(ZEXT416(0x7060504));
                auVar36._8_8_ = 0x8000000000000000;
                auVar36._0_8_ = 0x8000000000000000;
                auVar36._16_8_ = 0x8000000000000000;
                auVar36._24_8_ = 0x8000000000000000;
                auVar5 = vpcmpeqd_avx2((undefined1  [32])alVar27,(undefined1  [32])alVar27);
                auVar40._8_4_ = 8;
                auVar40._0_8_ = 0x800000008;
                auVar40._12_4_ = 8;
                auVar40._16_4_ = 8;
                auVar40._20_4_ = 8;
                auVar40._24_4_ = 8;
                auVar40._28_4_ = 8;
                do {
                  auVar41._8_8_ = uVar12;
                  auVar41._0_8_ = uVar12;
                  auVar41._16_8_ = uVar12;
                  auVar41._24_8_ = uVar12;
                  auVar42 = vpor_avx2(auVar41,auVar6);
                  auVar37 = vpor_avx2(auVar41,auVar35);
                  auVar37 = vpcmpgtq_avx2(auVar37 ^ auVar36,auVar38 ^ auVar36);
                  auVar42 = vpcmpgtq_avx2(auVar42 ^ auVar36,auVar38 ^ auVar36);
                  auVar37 = vpackssdw_avx2(auVar42,auVar37);
                  auVar4 = vpackssdw_avx(SUB3216(auVar37 ^ auVar5,0),SUB3216(auVar37 ^ auVar5,0x10))
                  ;
                  auVar4 = vpshufd_avx(auVar4,0xd8);
                  auVar37 = vpmovzxwd_avx2(auVar4);
                  auVar42 = vpslld_avx2(auVar37,0x1f);
                  auVar37 = vpaddd_avx2(auVar5,auVar34);
                  auVar37 = vpmulld_avx2(auVar37,auVar28);
                  auVar37 = vpsubd_avx2(auVar31,auVar37);
                  auVar37 = vpmaskmovd_avx2(auVar42,auVar37);
                  *(undefined1 (*) [32])(ptr_00 + uVar12 + 1) = auVar37;
                  uVar12 = uVar12 + 8;
                  auVar34 = vpaddd_avx2(auVar40,auVar34);
                } while ((s2Len + 7U & 0xfffffff8) != uVar12);
                alVar27 = (__m256i)vpsubd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar26);
                uVar11 = (int)size - 1;
                palVar14 = ptr_03 + uVar11;
                uVar12 = size;
                do {
                  *palVar14 = alVar27;
                  alVar27 = (__m256i)vpsubd_avx2((undefined1  [32])alVar27,auVar28);
                  palVar14 = palVar14 + -1;
                  iVar8 = (int)uVar12;
                  uVar18 = iVar8 - 1;
                  uVar12 = (ulong)uVar18;
                } while (uVar18 != 0 && 0 < iVar8);
                lVar13 = size * uVar20;
                local_a0 = 0;
                auVar34 = vpmovsxbd_avx2(ZEXT816(0x605040302010000));
                uVar12 = 0;
                auVar32 = ZEXT3264(auVar24);
                auVar33 = ZEXT3264(auVar25);
                do {
                  auVar5 = vpermd_avx2(auVar34,(undefined1  [32])ptr_02[uVar11]);
                  auVar5 = vpblendd_avx2(auVar5,ZEXT432((uint)ptr_00[uVar12]),1);
                  iVar8 = ppVar2->mapper[(byte)s2[uVar12]];
                  auVar31 = vpsubd_avx2(auVar24,(undefined1  [32])*ptr_03);
                  lVar22 = 0;
                  auVar6 = auVar24;
                  do {
                    auVar35 = vpaddd_avx2(auVar5,*(undefined1 (*) [32])
                                                  ((long)pvVar1 + lVar22 + (long)iVar8 * size * 0x20
                                                  ));
                    auVar5 = *(undefined1 (*) [32])((long)*ptr_02 + lVar22);
                    auVar37 = vpsubd_avx2(*(undefined1 (*) [32])((long)*ptr + lVar22),auVar28);
                    auVar36 = vpsubd_avx2(auVar5,auVar26);
                    auVar37 = vpmaxsd_avx2(auVar37,auVar36);
                    auVar31 = vpaddd_avx2(auVar31,*(undefined1 (*) [32])((long)*ptr_03 + lVar22));
                    auVar6 = vpmaxsd_avx2(auVar6,auVar31);
                    auVar31 = vpmaxsd_avx2(auVar37,auVar35);
                    *(undefined1 (*) [32])((long)*ptr + lVar22) = auVar37;
                    *(undefined1 (*) [32])((long)*ptr_01 + lVar22) = auVar31;
                    lVar22 = lVar22 + 0x20;
                  } while (size << 5 != lVar22);
                  auVar5 = vpermd_avx2(auVar34,auVar31);
                  lVar22 = uVar12 + 1;
                  uVar12 = uVar12 + 1;
                  auVar31 = vpblendd_avx2(auVar5,ZEXT432((uint)ptr_00[lVar22]),1);
                  auVar5 = vpaddd_avx2(auVar31,(undefined1  [32])*ptr_03);
                  auVar5 = vpmaxsd_avx2(auVar6,auVar5);
                  iVar8 = 6;
                  do {
                    auVar6 = vperm2i128_avx2(auVar5,auVar5,0x28);
                    auVar6 = vpalignr_avx2(auVar5,auVar6,0xc);
                    auVar6 = vpaddd_avx2(auVar6,auVar30);
                    auVar5 = vpmaxsd_avx2(auVar5,auVar6);
                    iVar8 = iVar8 + -1;
                  } while (iVar8 != 0);
                  auVar6 = vperm2i128_avx2(auVar5,auVar5,0x28);
                  auVar5 = vpalignr_avx2(auVar5,auVar6,0xc);
                  auVar5 = vpaddd_avx2(auVar5,auVar29);
                  auVar6 = vpmaxsd_avx2(auVar31,auVar5);
                  lVar15 = 0;
                  lVar22 = local_a0;
                  do {
                    auVar5 = vpsubd_avx2(auVar5,auVar28);
                    auVar6 = vpsubd_avx2(auVar6,auVar26);
                    auVar5 = vpmaxsd_avx2(auVar5,auVar6);
                    auVar6 = vpmaxsd_avx2(auVar5,*(undefined1 (*) [32])((long)*ptr_01 + lVar15));
                    *(undefined1 (*) [32])((long)*ptr_02 + lVar15) = auVar6;
                    piVar3 = ((ppVar9->field_4).rowcols)->score_row;
                    *(int *)((long)piVar3 + lVar22) = auVar6._0_4_;
                    *(int *)((long)piVar3 + lVar13 * 4 + lVar22) = auVar6._4_4_;
                    *(int *)((long)piVar3 + lVar13 * 8 + lVar22) = auVar6._8_4_;
                    *(int *)((long)piVar3 + lVar13 * 0xc + lVar22) = auVar6._12_4_;
                    *(int *)((long)piVar3 + lVar13 * 0x10 + lVar22) = auVar6._16_4_;
                    *(int *)((long)piVar3 + lVar13 * 0x14 + lVar22) = auVar6._20_4_;
                    *(int *)((long)piVar3 + lVar13 * 0x18 + lVar22) = auVar6._24_4_;
                    auVar35 = vpminsd_avx2(auVar33._0_32_,auVar6);
                    auVar33 = ZEXT3264(auVar35);
                    *(int *)((long)piVar3 + lVar13 * 0x1c + lVar22) = auVar6._28_4_;
                    auVar31 = vpmaxsd_avx2(auVar32._0_32_,auVar6);
                    auVar32 = ZEXT3264(auVar31);
                    lVar15 = lVar15 + 0x20;
                    lVar22 = lVar22 + uVar20 * 4;
                  } while (size << 5 != lVar15);
                  local_a0 = local_a0 + 4;
                } while (uVar12 != uVar20);
                alVar27 = ptr_02[(ulong)uVar16 % size];
                if (iVar7 < 7) {
                  iVar8 = 0;
                  do {
                    auVar30 = vperm2i128_avx2((undefined1  [32])alVar27,(undefined1  [32])alVar27,
                                              0x28);
                    alVar27 = (__m256i)vpalignr_avx2((undefined1  [32])alVar27,auVar30,0xc);
                    iVar8 = iVar8 + 1;
                  } while (iVar8 < 7 - iVar7);
                }
                auVar30 = vpcmpgtd_avx2(auVar24,auVar35);
                auVar34 = vpcmpgtd_avx2(auVar31,auVar25);
                auVar30 = vpor_avx2(auVar34,auVar30);
                if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar30 >> 0x7f,0) == '\0') &&
                      (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar30 >> 0xbf,0) == '\0') &&
                    (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar30[0x1f]) {
                  auVar30 = vpermq_avx2((undefined1  [32])alVar27,0xff);
                  auVar4 = vpshufd_avx(auVar30._0_16_,0x55);
                  auVar4 = vpinsrd_avx(auVar4,uVar16,1);
                  uVar23 = auVar4._0_8_;
                }
                else {
                  *(byte *)&ppVar9->flag = (byte)ppVar9->flag | 0x40;
                  uVar23 = 0;
                  iVar10 = 0;
                }
                ppVar9->score = (int)uVar23;
                ppVar9->end_query = (int)((ulong)uVar23 >> 0x20);
                ppVar9->end_ref = iVar10;
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(ptr);
                return ppVar9;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m256i vZero;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile32.score;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi32_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi32(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int32_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_32_t h;
            __m256i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi32(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 4);
        vHp = _mm256_insert_epi32_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi32(
                    _mm256_sub_epi32(vE, vGapE),
                    _mm256_sub_epi32(vH, vGapO));
            vHp = _mm256_add_epi32(vHp, vW);
            vF = _mm256_max_epi32(vF, _mm256_add_epi32(vHt, pvGapper[i]));
            vHt = _mm256_max_epi32(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 4);
        vHt = _mm256_insert_epi32_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi32(vF, _mm256_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 4);
            vFt = _mm256_add_epi32(vFt, vSegLenXgap);
            vF = _mm256_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 4);
        vF = _mm256_add_epi32(vF, vNegInfFront);
        vH = _mm256_max_epi32(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi32(
                    _mm256_sub_epi32(vF, vGapE),
                    _mm256_sub_epi32(vH, vGapO));
            vH = _mm256_max_epi32(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 4);
        }
        score = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}